

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.cpp
# Opt level: O0

int mbedtls_pk_debug(mbedtls_pk_context *ctx,mbedtls_pk_debug_item *items)

{
  undefined8 in_RSI;
  long *in_RDI;
  undefined4 local_4;
  
  if (*in_RDI == 0) {
    local_4 = -16000;
  }
  else if (*(long *)(*in_RDI + 0x58) == 0) {
    local_4 = -0x3f00;
  }
  else {
    (**(code **)(*in_RDI + 0x58))(in_RDI,in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mbedtls_pk_debug(const mbedtls_pk_context *ctx, mbedtls_pk_debug_item *items)
{
    if (ctx->pk_info == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (ctx->pk_info->debug_func == NULL) {
        return MBEDTLS_ERR_PK_TYPE_MISMATCH;
    }

    ctx->pk_info->debug_func((mbedtls_pk_context *) ctx, items);
    return 0;
}